

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

uint readuint(FILE *f,int bigendian)

{
  undefined8 in_RAX;
  size_t sVar1;
  uint uVar2;
  uchar c4;
  uchar c3;
  uchar c2;
  uchar c1;
  
  _c4 = (int)((ulong)in_RAX >> 0x20);
  sVar1 = fread(&c1,1,1,(FILE *)f);
  if ((((sVar1 != 0) && (sVar1 = fread(&c2,1,1,(FILE *)f), sVar1 != 0)) &&
      (sVar1 = fread(&c3,1,1,(FILE *)f), sVar1 != 0)) &&
     (sVar1 = fread(&c4,1,1,(FILE *)f), sVar1 != 0)) {
    if (bigendian == 0) {
      uVar2 = (uint)c2 << 8 | (uint)c3 << 0x10 | _c4 << 0x18;
      c4 = c1;
    }
    else {
      uVar2 = (uint)c3 << 8 | (uint)c2 << 0x10 | (uint)c1 << 0x18;
    }
    return c4 | uVar2;
  }
  fwrite("\nError: fread return a number of element different from the expected.\n",0x46,1,_stderr);
  return 0;
}

Assistant:

static unsigned int readuint(FILE * f, int bigendian)
{
    unsigned char c1, c2, c3, c4;
    if ( !fread(&c1, 1, 1, f) )
    {
        fprintf(stderr, "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if ( !fread(&c2, 1, 1, f) )
    {
        fprintf(stderr, "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if ( !fread(&c3, 1, 1, f) )
    {
        fprintf(stderr, "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if ( !fread(&c4, 1, 1, f) )
    {
        fprintf(stderr, "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (bigendian)
        return (unsigned int)(c1 << 24) + (unsigned int)(c2 << 16) + (unsigned int)(c3 << 8) + c4;
    else
        return (unsigned int)(c4 << 24) + (unsigned int)(c3 << 16) + (unsigned int)(c2 << 8) + c1;
}